

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_stdlib.cpp
# Opt level: O0

bool ImGui::InputTextMultiline
               (char *label,string *str,ImVec2 *size,ImGuiInputTextFlags flags,
               ImGuiInputTextCallback callback,void *user_data)

{
  bool bVar1;
  uint uVar2;
  ImGuiInputTextFlags extraout_var;
  uint in_ECX;
  ImVec2 *in_RSI;
  ImGuiInputTextCallback in_RDI;
  size_t in_R8;
  char *in_R9;
  InputTextCallback_UserData cb_user_data;
  ImGuiInputTextFlags flags_00;
  char *label_00;
  undefined4 in_stack_ffffffffffffffe0;
  
  if ((in_ECX & 0x40000) != 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/misc/cpp/imgui_stdlib.cpp"
                ,0x38,"InputTextMultiline","ImGui ASSERT FAILED: %s",
                "(flags & ImGuiInputTextFlags_CallbackResize) == 0");
  }
  uVar2 = in_ECX | 0x40000;
  label_00 = in_R9;
  std::__cxx11::string::c_str();
  flags_00 = extraout_var;
  std::__cxx11::string::capacity();
  bVar1 = InputTextMultiline(label_00,in_R9,in_R8,in_RSI,flags_00,in_RDI,
                             (void *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
  return bVar1;
}

Assistant:

bool ImGui::InputTextMultiline(const char* label, std::string* str, const ImVec2& size, ImGuiInputTextFlags flags, ImGuiInputTextCallback callback, void* user_data)
{
    IM_ASSERT((flags & ImGuiInputTextFlags_CallbackResize) == 0);
    flags |= ImGuiInputTextFlags_CallbackResize;

    InputTextCallback_UserData cb_user_data;
    cb_user_data.Str = str;
    cb_user_data.ChainCallback = callback;
    cb_user_data.ChainCallbackUserData = user_data;
    return InputTextMultiline(label, (char*)str->c_str(), str->capacity() + 1, size, flags, InputTextCallback, &cb_user_data);
}